

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O2

int wb_write_out(archive_write *a)

{
  void *buff;
  void *pvVar1;
  long lVar2;
  int iVar3;
  ulong __n;
  ulong uVar4;
  long lVar5;
  
  pvVar1 = a->format_data;
  lVar2 = *(long *)((long)pvVar1 + 0x102e0);
  uVar4 = -lVar2 + 0x10000;
  __n = (ulong)((uint)uVar4 & 0x7ff);
  buff = (void *)((long)pvVar1 + 0x2dc);
  uVar4 = uVar4 & 0xfffffffffffff800;
  if (*(int *)((long)pvVar1 + 0x102e8) == 0) {
    iVar3 = __archive_write_output(a,buff,uVar4);
  }
  else {
    iVar3 = write_to_temp(a,buff,uVar4);
  }
  lVar5 = uVar4 + *(long *)((long)pvVar1 + 0x102f0);
  *(long *)((long)pvVar1 + 0x102f0) = lVar5;
  if (*(long *)((long)pvVar1 + 0x102f8) < lVar5) {
    *(long *)((long)pvVar1 + 0x102f8) = lVar5;
  }
  *(undefined8 *)((long)pvVar1 + 0x102e0) = 0x10000;
  if (__n != 0) {
    *(ulong *)((long)pvVar1 + 0x102e0) = 0x10000 - __n;
    memmove(buff,(void *)((long)pvVar1 + ((-lVar2 + 0x102dc) - __n)),__n);
  }
  return iVar3;
}

Assistant:

static int
wb_write_out(struct archive_write *a)
{
	struct iso9660 *iso9660 = (struct iso9660 *)a->format_data;
	size_t wsize, nw;
	int r;

	wsize = sizeof(iso9660->wbuff) - iso9660->wbuff_remaining;
	nw = wsize % LOGICAL_BLOCK_SIZE;
	if (iso9660->wbuff_type == WB_TO_STREAM)
		r = __archive_write_output(a, iso9660->wbuff, wsize - nw);
	else
		r = write_to_temp(a, iso9660->wbuff, wsize - nw);
	/* Increase the offset. */
	iso9660->wbuff_offset += wsize - nw;
	if (iso9660->wbuff_offset > iso9660->wbuff_written)
		iso9660->wbuff_written = iso9660->wbuff_offset;
	iso9660->wbuff_remaining = sizeof(iso9660->wbuff);
	if (nw) {
		iso9660->wbuff_remaining -= nw;
		memmove(iso9660->wbuff, iso9660->wbuff + wsize - nw, nw);
	}
	return (r);
}